

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O0

void __thiscall
Am_Drawonable_Impl::Clear_Area
          (Am_Drawonable_Impl *this,int arg_left,int arg_top,int arg_width,int arg_height)

{
  int arg_height_local;
  int arg_width_local;
  int arg_top_local;
  int arg_left_local;
  Am_Drawonable_Impl *this_local;
  
  set_gc_using_fill(this,&(this->super_Am_Drawonable).background_color,Am_DRAW_COPY,0);
  XSetTSOrigin(this->screen->display,this->screen->gc,0);
  XFillRectangle(this->screen->display,this->xlib_drawable,this->screen->gc,arg_left,arg_top,
                 arg_width,arg_height);
  return;
}

Assistant:

void
Am_Drawonable_Impl::Clear_Area(int arg_left, int arg_top, int arg_width,
                               int arg_height)
{

  set_gc_using_fill(background_color, Am_DRAW_COPY);
  // keep origin of stipple, if any, in the same spot.
  XSetTSOrigin(screen->display, screen->gc, 0, 0);
  XFillRectangle(screen->display, xlib_drawable, screen->gc, arg_left, arg_top,
                 arg_width, arg_height);
  /*

  Region x_rgn = ((Am_Region_Impl *)screen->clip_region)->region_to_use();

  if ( ! x_rgn ) {
    // Then the GC's clip_region is empty, so don't clip
//    XClearArea (screen->display, xlib_drawable, arg_left, arg_top,
//		arg_width, arg_height, 0);
      set_gc_using_fill (background_color, Am_DRAW_COPY);
      XFillRectangle (screen->display, xlib_drawable, screen->gc,
		      arg_left, arg_top, arg_width, arg_height);
    }
  else {

    // If width and height parameters are 0, set them to extend from
    // the arg_left and arg_top to the edges of the window.
    if (arg_width  == 0) arg_width  = width  - arg_left;
    if (arg_height == 0) arg_height = height - arg_top;

    XRectangle clip_rect;
    XClipBox(x_rgn, &clip_rect);

    int right  = arg_left + arg_width;
    int bottom = arg_top + arg_height;
    int gc_right  = clip_rect.x + clip_rect.width;
    int gc_bottom = clip_rect.y + clip_rect.height;

    int clip_left   = MAX(clip_rect.x, arg_left);
    int clip_top    = MAX(clip_rect.y, arg_top);
    int clip_right  = MIN(right, gc_right);
    int clip_bottom = MIN(bottom, gc_bottom);

    int clip_width  = clip_right  - clip_left;
    int clip_height = clip_bottom - clip_top;

//    printf("arg_left = %d, arg_top = %d, arg_width = %d, arg_height = %d,\n",
//	   arg_left, arg_top, arg_width, arg_height);
//    printf("gc_right = %d, gc_bottom = %d\n", gc_right, gc_bottom);
//    printf("clip_left = %d, clip_top = %d, clip_width = %d, clip_height = %d\n\n",
	   clip_left, clip_top, clip_width, clip_height);

    if ((clip_width > 0) && (clip_height > 0)) {
      set_gc_using_fill (background_color, Am_DRAW_COPY);
      XFillRectangle (screen->display, xlib_drawable, screen->gc,
		      clip_left, clip_top, clip_width, clip_height);

      //XClearArea (screen->display, xlib_drawable, clip_left, clip_top,
      //	  clip_width, clip_height, 0);
    }
  }
*/
}